

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  LodePNGColorType LVar1;
  byte b_00;
  byte bVar2;
  byte bVar3;
  LodePNGColorProfile *pLVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 in_register_0000000c;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong in_R11;
  undefined7 uVar11;
  size_t sVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_112;
  unsigned_short local_110;
  unsigned_short local_10e;
  unsigned_short local_10c;
  byte local_109;
  LodePNGColorProfile *local_108;
  byte local_fb;
  byte local_fa;
  byte local_f9;
  ulong local_f8;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uchar *local_e0;
  LodePNGColorMode *local_d8;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  local_f8 = CONCAT44(in_register_0000000c,h);
  LVar1 = mode->colortype;
  bVar13 = (LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY;
  local_e0 = in;
  uVar5 = lodepng_can_have_alpha(mode);
  iVar7 = 0;
  if ((ulong)LVar1 < 7) {
    iVar7 = *(int *)(&DAT_00121364 + (ulong)LVar1 * 4);
  }
  local_f8 = (ulong)((int)local_f8 * w);
  local_ec = iVar7 * mode->bitdepth;
  bVar14 = local_ec == 1;
  local_f0 = 2;
  if (8 < local_ec) {
    local_f0 = 0x101;
  }
  if ((8 >= local_ec && !bVar14) && (local_f0 = 4, local_ec != 2)) {
    local_f0 = 0x100;
    if (local_ec == 4) {
      local_f0 = 0x10;
    }
  }
  uVar5 = uVar5 ^ 1;
  uVar8 = (ulong)bVar13;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  local_108 = profile;
  local_d8 = mode;
  if ((mode->bitdepth == 0x10) && (local_f8 != 0)) {
    sVar12 = 0;
    do {
      getPixelColorRGBA16(&local_10e,&local_110,&local_112,&local_10c,local_e0,sVar12,local_d8);
      if (((((local_10e & 0xff) != local_10e >> 8) || ((local_110 & 0xff) != local_110 >> 8)) ||
          ((local_112 & 0xff) != local_112 >> 8)) || ((local_10c & 0xff) != local_10c >> 8)) {
        sVar12 = 0;
        local_10e = 0;
        local_110 = 0;
        local_112 = 0;
        local_10c = 0;
        profile->bits = 0x10;
        goto LAB_0011906e;
      }
      sVar12 = sVar12 + 1;
    } while (local_f8 != sVar12);
  }
  local_e4 = (uint)bVar13;
  bVar13 = false;
  local_10e = local_10e & 0xff00;
  local_110 = local_110 & 0xff00;
  local_112 = local_112 & 0xff00;
  local_10c = local_10c & 0xff00;
  local_109 = bVar14;
  local_e8 = uVar5;
  if (local_f8 != 0) {
    sVar12 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_10e,(uchar *)&local_110,(uchar *)&local_112,
                         (uchar *)&local_10c,local_e0,sVar12,local_d8);
      uVar5 = local_108->bits;
      bVar9 = (byte)local_10e;
      if (uVar5 < 8 && (local_109 & 1) == 0) {
        uVar6 = 1;
        if ((1 < (byte)((byte)local_10e + 1)) && (uVar6 = 8, (byte)((byte)local_10e * -0xf) < 0x10))
        {
          uVar6 = (uint)(3 < (byte)((byte)local_10e * -3)) * 2 + 2;
        }
        if (uVar5 < uVar6) {
          local_108->bits = uVar6;
          uVar5 = uVar6;
        }
      }
      local_109 = local_ec <= uVar5;
      uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
      in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
      bVar14 = local_e4 == 0;
      local_e4 = 1;
      bVar2 = (byte)local_110;
      b_00 = (byte)local_112;
      uVar6 = uVar5;
      if (bVar14) {
        if ((byte)local_10e == (byte)local_110) {
          in_R11 = 0;
          local_e4 = 0;
          if ((byte)local_10e == (byte)local_112) goto LAB_00118cf6;
        }
        local_108->colored = 1;
        uVar11 = (undefined7)(in_R11 >> 8);
        in_R11 = CONCAT71(uVar11,1);
        local_e4 = 1;
        if (uVar5 < 8) {
          local_108->bits = 8;
          uVar6 = 8;
          in_R11 = CONCAT71(uVar11,1);
        }
      }
LAB_00118cf6:
      bVar3 = (byte)local_10c;
      if (local_e8 == 0) {
        if ((local_108->key_r == (local_10e & 0xff)) && (local_108->key_g == (local_110 & 0xff))) {
          bVar14 = local_108->key_b == (local_112 & 0xff);
        }
        else {
          bVar14 = false;
        }
        if ((byte)local_10c == 0xff) {
          uVar8 = 0;
          local_e8 = 0;
          if ((bool)(local_108->key != 0 & bVar14)) {
            local_108->alpha = 1;
            local_108->key = 0;
            if (uVar6 < 8) goto LAB_00118f0f;
            goto LAB_00118d03;
          }
        }
        else {
          if (((byte)local_10c != 0) || (local_108->key != 0 && !bVar14)) {
            local_108->alpha = 1;
            local_108->key = 0;
            if (uVar6 < 8) {
LAB_00118f0f:
              local_108->bits = 8;
              goto LAB_00118d03;
            }
            goto LAB_00118d06;
          }
          uVar8 = 0;
          local_e8 = 0;
          if (local_108->key == 0 && local_108->alpha == 0) {
            local_108->key = 1;
            local_108->key_r = local_10e & 0xff;
            local_108->key_g = local_110 & 0xff;
            local_108->key_b = local_112 & 0xff;
            uVar8 = 0;
            local_e8 = 0;
          }
        }
      }
      else {
LAB_00118d03:
        uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
LAB_00118d06:
        local_e8 = 1;
      }
      bVar14 = true;
      if (bVar13) {
LAB_00118d18:
        bVar13 = bVar14;
        bVar9 = (byte)uVar8 & bVar13;
        uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar9);
        bVar9 = (byte)in_R11 & bVar9;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar9);
        if ((bVar9 == 1) && (local_ec <= uVar5)) break;
      }
      else {
        local_c4 = (uint)uVar8;
        local_c0 = (uint)in_R11;
        uVar8 = CONCAT71((int7)(uVar8 >> 8),(byte)local_110);
        local_c8 = (uint)(byte)local_110;
        local_cc = (uint)(byte)local_10e;
        local_d0 = (uint)(byte)local_10c;
        local_bc = uVar5;
        iVar7 = color_tree_get((ColorTree *)local_b8,(byte)local_10e,(byte)local_110,(byte)local_112
                               ,(byte)local_10c);
        pLVar4 = local_108;
        bVar13 = false;
        if (iVar7 < 0) {
          local_fb = bVar3;
          local_fa = b_00;
          local_f9 = bVar2;
          color_tree_add((ColorTree *)local_b8,(uchar)local_cc,(uchar)local_c8,b_00,(uchar)local_d0,
                         local_108->numcolors);
          uVar6 = pLVar4->numcolors;
          if ((ulong)uVar6 < 0x100) {
            uVar8 = (ulong)(uVar6 * 4);
            pLVar4->palette[(ulong)uVar6 * 4] = bVar9;
            pLVar4->palette[uVar8 + 1] = local_f9;
            pLVar4->palette[uVar8 + 2] = local_fa;
            pLVar4->palette[uVar8 + 3] = local_fb;
          }
          pLVar4->numcolors = uVar6 + 1;
          in_R11 = (ulong)local_c0;
          uVar8 = (ulong)local_c4;
          uVar5 = local_bc;
          bVar14 = local_f0 <= uVar6 + 1;
          goto LAB_00118d18;
        }
      }
      sVar12 = sVar12 + 1;
    } while (local_f8 != sVar12);
  }
  if ((local_108->key != 0) && (local_108->alpha == 0 && (int)local_f8 != 0)) {
    sVar12 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_10e,(uchar *)&local_110,(uchar *)&local_112,
                         (uchar *)&local_10c,local_e0,sVar12,local_d8);
      if (((((byte)local_10c != '\0') && (local_108->key_r == (local_10e & 0xff))) &&
          (local_108->key_g == (local_110 & 0xff))) && (local_108->key_b == (local_112 & 0xff))) {
        local_108->alpha = 1;
        local_108->key = 0;
        if (local_108->bits < 8) {
          local_108->bits = 8;
        }
      }
      sVar12 = sVar12 + 1;
    } while (local_f8 != sVar12);
  }
  uVar5._0_2_ = local_108->key_r;
  uVar5._2_2_ = local_108->key_g;
  auVar15 = psllw(ZEXT416(uVar5),8);
  local_108->key_r = auVar15._0_2_ + (undefined2)uVar5;
  local_108->key_g = auVar15._2_2_ + uVar5._2_2_;
  local_108->key_b = (short)(*(int *)&local_108->key_b << 8) + (short)*(int *)&local_108->key_b;
LAB_0011901d:
  color_tree_cleanup((ColorTree *)local_b8);
  return 0;
  while (sVar12 = sVar12 + 1, uVar8 = uVar10, local_f8 != sVar12) {
LAB_0011906e:
    getPixelColorRGBA16(&local_10e,&local_110,&local_112,&local_10c,local_e0,sVar12,local_d8);
    uVar10 = 1;
    bVar13 = true;
    if ((int)uVar8 == 0) {
      if (local_10e == local_110) {
        bVar13 = false;
        uVar10 = 0;
        if (local_10e == local_112) goto LAB_001190cc;
      }
      profile->colored = 1;
      bVar13 = true;
      uVar10 = 1;
    }
LAB_001190cc:
    if (uVar5 == 0) {
      if ((local_10e == profile->key_r) && (local_110 == profile->key_g)) {
        bVar14 = local_112 == profile->key_b;
      }
      else {
        bVar14 = false;
      }
      if (local_10c == 0xffff) {
        uVar5 = 0;
        if ((bool)(profile->key != 0 & bVar14)) goto LAB_0011916a;
      }
      else {
        if ((local_10c != 0) || (!(bool)(profile->key == 0 | bVar14))) {
LAB_0011916a:
          profile->alpha = 1;
          profile->key = 0;
          goto LAB_0011917c;
        }
        uVar5 = 0;
        if (profile->key == 0 && profile->alpha == 0) {
          profile->key = 1;
          profile->key_r = local_10e;
          profile->key_g = local_110;
          profile->key_b = local_112;
        }
      }
    }
    else {
LAB_0011917c:
      uVar5 = 1;
      if (bVar13) break;
    }
  }
  if ((profile->key != 0) && (local_108->alpha == 0)) {
    sVar12 = 0;
    do {
      getPixelColorRGBA16(&local_10e,&local_110,&local_112,&local_10c,local_e0,sVar12,local_d8);
      if ((((local_10c != 0) && (local_10e == local_108->key_r)) && (local_110 == local_108->key_g))
         && (local_112 == local_108->key_b)) {
        local_108->alpha = 1;
        local_108->key = 0;
      }
      sVar12 = sVar12 + 1;
    } while (local_f8 != sVar12);
  }
  goto LAB_0011901d;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}